

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void * gtemplate_new_old(t_symbol *s,int argc,t_atom *argv)

{
  _glist *p_Var1;
  t_symbol *sym_00;
  void *pvVar2;
  t_symbol *sym;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  p_Var1 = canvas_getcurrent();
  sym_00 = canvas_makebindsym(p_Var1->gl_name);
  if (gtemplate_new_old::warned == 0) {
    post("warning -- \'template\' (%s) is obsolete; replace with \'struct\'",sym_00->s_name);
    gtemplate_new_old::warned = 1;
  }
  pvVar2 = gtemplate_donew(sym_00,argc,argv);
  return pvVar2;
}

Assistant:

static void *gtemplate_new_old(t_symbol *s, int argc, t_atom *argv)
{
    t_symbol *sym = canvas_makebindsym(canvas_getcurrent()->gl_name);
    static int warned;
    if (!warned)
    {
        post("warning -- 'template' (%s) is obsolete; replace with 'struct'",
            sym->s_name);
        warned = 1;
    }
    return (gtemplate_donew(sym, argc, argv));
}